

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_half_pass.cpp
# Opt level: O3

void __thiscall spvtools::opt::ConvertToHalfPass::Initialize(ConvertToHalfPass *this)

{
  long lVar1;
  undefined4 *puVar2;
  Op *pOVar3;
  byte bVar4;
  initializer_list<spv::Op> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<spv::Op> __l_01;
  initializer_list<spv::Op> __l_02;
  initializer_list<spv::Op> __l_03;
  Op local_d8 [50];
  
  bVar4 = 0;
  memcpy(local_d8,&DAT_007753e4,0x90);
  __l._M_len = 0x24;
  __l._M_array = local_d8;
  std::
  _Hashtable<spv::Op,_spv::Op,_std::allocator<spv::Op>,_std::__detail::_Identity,_std::equal_to<spv::Op>,_spvtools::opt::ConvertToHalfPass::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::operator=(&(this->target_ops_core_)._M_h,__l);
  memcpy(local_d8,&DAT_00775474,200);
  __l_00._M_len = 0x32;
  __l_00._M_array = local_d8;
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::operator=(&(this->target_ops_450_)._M_h,__l_00);
  puVar2 = &DAT_0077553c;
  pOVar3 = local_d8;
  for (lVar1 = 0x19; lVar1 != 0; lVar1 = lVar1 + -1) {
    *pOVar3 = *puVar2;
    puVar2 = puVar2 + (ulong)bVar4 * -2 + 1;
    pOVar3 = pOVar3 + (ulong)bVar4 * -2 + 1;
  }
  __l_01._M_len = 0x19;
  __l_01._M_array = local_d8;
  std::
  _Hashtable<spv::Op,_spv::Op,_std::allocator<spv::Op>,_std::__detail::_Identity,_std::equal_to<spv::Op>,_spvtools::opt::ConvertToHalfPass::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::operator=(&(this->image_ops_)._M_h,__l_01);
  local_d8[4] = OpImageDrefGather;
  local_d8[5] = OpImageSparseSampleDrefImplicitLod;
  local_d8[6] = OpImageSparseSampleDrefExplicitLod;
  local_d8[7] = OpImageSparseSampleProjDrefImplicitLod;
  local_d8[0] = OpImageSampleDrefImplicitLod;
  local_d8[1] = OpImageSampleDrefExplicitLod;
  local_d8[2] = OpImageSampleProjDrefImplicitLod;
  local_d8[3] = OpImageSampleProjDrefExplicitLod;
  local_d8[8] = OpImageSparseSampleProjDrefExplicitLod;
  local_d8[9] = OpImageSparseDrefGather;
  __l_02._M_len = 10;
  __l_02._M_array = local_d8;
  std::
  _Hashtable<spv::Op,_spv::Op,_std::allocator<spv::Op>,_std::__detail::_Identity,_std::equal_to<spv::Op>,_spvtools::opt::ConvertToHalfPass::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::operator=(&(this->dref_image_ops_)._M_h,__l_02);
  local_d8[4] = OpCompositeInsert;
  local_d8[5] = OpCompositeExtract;
  local_d8[6] = OpCopyObject;
  local_d8[7] = OpTranspose;
  local_d8[0] = OpVectorExtractDynamic;
  local_d8[1] = OpVectorInsertDynamic;
  local_d8[2] = OpVectorShuffle;
  local_d8[3] = OpCompositeConstruct;
  local_d8[8] = 0xf5;
  __l_03._M_len = 9;
  __l_03._M_array = local_d8;
  std::
  _Hashtable<spv::Op,_spv::Op,_std::allocator<spv::Op>,_std::__detail::_Identity,_std::equal_to<spv::Op>,_spvtools::opt::ConvertToHalfPass::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::operator=(&(this->closure_ops_)._M_h,__l_03);
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::clear(&(this->relaxed_ids_set_)._M_h);
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::clear(&(this->converted_ids_)._M_h);
  return;
}

Assistant:

void ConvertToHalfPass::Initialize() {
  target_ops_core_ = {
      spv::Op::OpVectorExtractDynamic,
      spv::Op::OpVectorInsertDynamic,
      spv::Op::OpVectorShuffle,
      spv::Op::OpCompositeConstruct,
      spv::Op::OpCompositeInsert,
      spv::Op::OpCompositeExtract,
      spv::Op::OpCopyObject,
      spv::Op::OpTranspose,
      spv::Op::OpConvertSToF,
      spv::Op::OpConvertUToF,
      // spv::Op::OpFConvert,
      // spv::Op::OpQuantizeToF16,
      spv::Op::OpFNegate,
      spv::Op::OpFAdd,
      spv::Op::OpFSub,
      spv::Op::OpFMul,
      spv::Op::OpFDiv,
      spv::Op::OpFMod,
      spv::Op::OpVectorTimesScalar,
      spv::Op::OpMatrixTimesScalar,
      spv::Op::OpVectorTimesMatrix,
      spv::Op::OpMatrixTimesVector,
      spv::Op::OpMatrixTimesMatrix,
      spv::Op::OpOuterProduct,
      spv::Op::OpDot,
      spv::Op::OpSelect,
      spv::Op::OpFOrdEqual,
      spv::Op::OpFUnordEqual,
      spv::Op::OpFOrdNotEqual,
      spv::Op::OpFUnordNotEqual,
      spv::Op::OpFOrdLessThan,
      spv::Op::OpFUnordLessThan,
      spv::Op::OpFOrdGreaterThan,
      spv::Op::OpFUnordGreaterThan,
      spv::Op::OpFOrdLessThanEqual,
      spv::Op::OpFUnordLessThanEqual,
      spv::Op::OpFOrdGreaterThanEqual,
      spv::Op::OpFUnordGreaterThanEqual,
  };
  target_ops_450_ = {
      GLSLstd450Round, GLSLstd450RoundEven, GLSLstd450Trunc, GLSLstd450FAbs,
      GLSLstd450FSign, GLSLstd450Floor, GLSLstd450Ceil, GLSLstd450Fract,
      GLSLstd450Radians, GLSLstd450Degrees, GLSLstd450Sin, GLSLstd450Cos,
      GLSLstd450Tan, GLSLstd450Asin, GLSLstd450Acos, GLSLstd450Atan,
      GLSLstd450Sinh, GLSLstd450Cosh, GLSLstd450Tanh, GLSLstd450Asinh,
      GLSLstd450Acosh, GLSLstd450Atanh, GLSLstd450Atan2, GLSLstd450Pow,
      GLSLstd450Exp, GLSLstd450Log, GLSLstd450Exp2, GLSLstd450Log2,
      GLSLstd450Sqrt, GLSLstd450InverseSqrt, GLSLstd450Determinant,
      GLSLstd450MatrixInverse,
      // TODO(greg-lunarg): GLSLstd450ModfStruct,
      GLSLstd450FMin, GLSLstd450FMax, GLSLstd450FClamp, GLSLstd450FMix,
      GLSLstd450Step, GLSLstd450SmoothStep, GLSLstd450Fma,
      // TODO(greg-lunarg): GLSLstd450FrexpStruct,
      GLSLstd450Ldexp, GLSLstd450Length, GLSLstd450Distance, GLSLstd450Cross,
      GLSLstd450Normalize, GLSLstd450FaceForward, GLSLstd450Reflect,
      GLSLstd450Refract, GLSLstd450NMin, GLSLstd450NMax, GLSLstd450NClamp};
  image_ops_ = {spv::Op::OpImageSampleImplicitLod,
                spv::Op::OpImageSampleExplicitLod,
                spv::Op::OpImageSampleDrefImplicitLod,
                spv::Op::OpImageSampleDrefExplicitLod,
                spv::Op::OpImageSampleProjImplicitLod,
                spv::Op::OpImageSampleProjExplicitLod,
                spv::Op::OpImageSampleProjDrefImplicitLod,
                spv::Op::OpImageSampleProjDrefExplicitLod,
                spv::Op::OpImageFetch,
                spv::Op::OpImageGather,
                spv::Op::OpImageDrefGather,
                spv::Op::OpImageRead,
                spv::Op::OpImageSparseSampleImplicitLod,
                spv::Op::OpImageSparseSampleExplicitLod,
                spv::Op::OpImageSparseSampleDrefImplicitLod,
                spv::Op::OpImageSparseSampleDrefExplicitLod,
                spv::Op::OpImageSparseSampleProjImplicitLod,
                spv::Op::OpImageSparseSampleProjExplicitLod,
                spv::Op::OpImageSparseSampleProjDrefImplicitLod,
                spv::Op::OpImageSparseSampleProjDrefExplicitLod,
                spv::Op::OpImageSparseFetch,
                spv::Op::OpImageSparseGather,
                spv::Op::OpImageSparseDrefGather,
                spv::Op::OpImageSparseTexelsResident,
                spv::Op::OpImageSparseRead};
  dref_image_ops_ = {
      spv::Op::OpImageSampleDrefImplicitLod,
      spv::Op::OpImageSampleDrefExplicitLod,
      spv::Op::OpImageSampleProjDrefImplicitLod,
      spv::Op::OpImageSampleProjDrefExplicitLod,
      spv::Op::OpImageDrefGather,
      spv::Op::OpImageSparseSampleDrefImplicitLod,
      spv::Op::OpImageSparseSampleDrefExplicitLod,
      spv::Op::OpImageSparseSampleProjDrefImplicitLod,
      spv::Op::OpImageSparseSampleProjDrefExplicitLod,
      spv::Op::OpImageSparseDrefGather,
  };
  closure_ops_ = {
      spv::Op::OpVectorExtractDynamic,
      spv::Op::OpVectorInsertDynamic,
      spv::Op::OpVectorShuffle,
      spv::Op::OpCompositeConstruct,
      spv::Op::OpCompositeInsert,
      spv::Op::OpCompositeExtract,
      spv::Op::OpCopyObject,
      spv::Op::OpTranspose,
      spv::Op::OpPhi,
  };
  relaxed_ids_set_.clear();
  converted_ids_.clear();
}